

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_field_sample_generated.h
# Opt level: O0

int __thiscall keyfield::sample::Apple::KeyCompareWithValue(Apple *this,Color *_color)

{
  byte bVar1;
  byte bVar2;
  Color *this_00;
  Array<float,_(unsigned_short)3> *_rgb;
  uint8_t rhs_color_tag;
  uint8_t lhs_color_tag;
  int rgb_compare_result;
  Array<float,_(unsigned_short)3> *rhs_color_rgb;
  Color *rhs_color;
  Color *lhs_color;
  Color *_color_local;
  Apple *this_local;
  
  this_00 = color(this);
  _rgb = Color::rgb(_color);
  this_local._4_4_ = Color::KeyCompareWithValue(this_00,_rgb);
  if (this_local._4_4_ == 0) {
    bVar1 = Color::tag(this_00);
    bVar2 = Color::tag(_color);
    if (bVar1 == bVar2) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = (uint)(bVar2 < bVar1) - (uint)(bVar1 < bVar2);
    }
  }
  return this_local._4_4_;
}

Assistant:

int KeyCompareWithValue(const keyfield::sample::Color &_color) const {
    const auto &lhs_color = color();
    const auto &rhs_color = _color;
    const auto rhs_color_rgb = rhs_color.rgb();
    const auto rgb_compare_result = lhs_color.KeyCompareWithValue(rhs_color_rgb);
    if (rgb_compare_result != 0)
      return rgb_compare_result;
    const auto lhs_color_tag = lhs_color.tag();
    const auto rhs_color_tag = rhs_color.tag();
    if (lhs_color_tag != rhs_color_tag)
      return static_cast<int>(lhs_color_tag > rhs_color_tag) - static_cast<int>(lhs_color_tag < rhs_color_tag);
    return 0;
  }